

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O0

bool ImGui_ImplOpenGL3_Init(char *glsl_version)

{
  int iVar1;
  size_t sVar2;
  GLubyte *__s1;
  char *extension;
  GLint local_38;
  GLint i;
  GLint num_extensions;
  GLint current_texture;
  char *gl_loader;
  ImGuiIO *io;
  char *gl_version;
  GLint minor;
  GLint major;
  char *glsl_version_local;
  
  gl_version._4_4_ = 0;
  gl_version._0_4_ = 0;
  _minor = glsl_version;
  (*glad_debug_glGetIntegerv)(0x821b,(GLint *)((long)&gl_version + 4));
  (*glad_debug_glGetIntegerv)(0x821c,(GLint *)&gl_version);
  if ((gl_version._4_4_ == 0) && ((int)gl_version == 0)) {
    io = (ImGuiIO *)(*glad_debug_glGetString)(0x1f02);
    __isoc99_sscanf(io,"%d.%d",(long)&gl_version + 4,&gl_version);
  }
  g_GlVersion = gl_version._4_4_ * 100 + (int)gl_version * 10;
  gl_loader = (char *)ImGui::GetIO();
  ((ImGuiIO *)gl_loader)->BackendRendererName = "imgui_impl_opengl3";
  if (0x13f < g_GlVersion) {
    ((ImGuiIO *)gl_loader)->BackendFlags = ((ImGuiIO *)gl_loader)->BackendFlags | 8;
  }
  if (_minor == (char *)0x0) {
    _minor = "#version 130";
  }
  sVar2 = strlen(_minor);
  if ((int)sVar2 + 2 < 0x20) {
    strcpy(g_GlslVersionString,_minor);
    strcat(g_GlslVersionString,"\n");
    _num_extensions = "GLAD";
    (*glad_debug_glGetIntegerv)(0x8069,&i);
    g_HasClipOrigin = 0x1c1 < g_GlVersion;
    local_38 = 0;
    (*glad_debug_glGetIntegerv)(0x821d,&local_38);
    for (extension._4_4_ = 0; (int)extension._4_4_ < local_38; extension._4_4_ = extension._4_4_ + 1
        ) {
      __s1 = (*glad_debug_glGetStringi)(0x1f03,extension._4_4_);
      iVar1 = strcmp((char *)__s1,"GL_ARB_clip_control");
      if (iVar1 == 0) {
        g_HasClipOrigin = true;
      }
    }
    return true;
  }
  __assert_fail("(int)strlen(glsl_version) + 2 < ((int)(sizeof(g_GlslVersionString) / sizeof(*(g_GlslVersionString))))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_impl_opengl3.cpp"
                ,0xcf,"bool ImGui_ImplOpenGL3_Init(const char *)");
}

Assistant:

bool    ImGui_ImplOpenGL3_Init(const char* glsl_version)
{
    // Query for GL version (e.g. 320 for GL 3.2)
#if !defined(IMGUI_IMPL_OPENGL_ES2)
    GLint major = 0;
    GLint minor = 0;
    glGetIntegerv(GL_MAJOR_VERSION, &major);
    glGetIntegerv(GL_MINOR_VERSION, &minor);
    if (major == 0 && minor == 0)
    {
        // Query GL_VERSION in desktop GL 2.x, the string will start with "<major>.<minor>"
        const char* gl_version = (const char*)glGetString(GL_VERSION);
        sscanf(gl_version, "%d.%d", &major, &minor);
    }
    g_GlVersion = (GLuint)(major * 100 + minor * 10);
#else
    g_GlVersion = 200; // GLES 2
#endif

    // Setup backend capabilities flags
    ImGuiIO& io = ImGui::GetIO();
    io.BackendRendererName = "imgui_impl_opengl3";
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_VTX_OFFSET
    if (g_GlVersion >= 320)
        io.BackendFlags |= ImGuiBackendFlags_RendererHasVtxOffset;  // We can honor the ImDrawCmd::VtxOffset field, allowing for large meshes.
#endif

    // Store GLSL version string so we can refer to it later in case we recreate shaders.
    // Note: GLSL version is NOT the same as GL version. Leave this to NULL if unsure.
#if defined(IMGUI_IMPL_OPENGL_ES2)
    if (glsl_version == NULL)
        glsl_version = "#version 100";
#elif defined(IMGUI_IMPL_OPENGL_ES3)
    if (glsl_version == NULL)
        glsl_version = "#version 300 es";
#elif defined(__APPLE__)
    if (glsl_version == NULL)
        glsl_version = "#version 150";
#else
    if (glsl_version == NULL)
        glsl_version = "#version 130";
#endif
    IM_ASSERT((int)strlen(glsl_version) + 2 < IM_ARRAYSIZE(g_GlslVersionString));
    strcpy(g_GlslVersionString, glsl_version);
    strcat(g_GlslVersionString, "\n");

    // Debugging construct to make it easily visible in the IDE and debugger which GL loader has been selected.
    // The code actually never uses the 'gl_loader' variable! It is only here so you can read it!
    // If auto-detection fails or doesn't select the same GL loader file as used by your application,
    // you are likely to get a crash below.
    // You can explicitly select a loader by using '#define IMGUI_IMPL_OPENGL_LOADER_XXX' in imconfig.h or compiler command-line.
    const char* gl_loader = "Unknown";
    IM_UNUSED(gl_loader);
#if defined(IMGUI_IMPL_OPENGL_LOADER_GL3W)
    gl_loader = "GL3W";
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLEW)
    gl_loader = "GLEW";
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLAD)
    gl_loader = "GLAD";
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLAD2)
    gl_loader = "GLAD2";
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLBINDING2)
    gl_loader = "glbinding2";
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLBINDING3)
    gl_loader = "glbinding3";
#elif defined(IMGUI_IMPL_OPENGL_LOADER_CUSTOM)
    gl_loader = "custom";
#else
    gl_loader = "none";
#endif

    // Make an arbitrary GL call (we don't actually need the result)
    // IF YOU GET A CRASH HERE: it probably means that you haven't initialized the OpenGL function loader used by this code.
    // Desktop OpenGL 3/4 need a function loader. See the IMGUI_IMPL_OPENGL_LOADER_xxx explanation above.
    GLint current_texture;
    glGetIntegerv(GL_TEXTURE_BINDING_2D, &current_texture);

    // Detect extensions we support
    g_HasClipOrigin = (g_GlVersion >= 450);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_EXTENSIONS
    GLint num_extensions = 0;
    glGetIntegerv(GL_NUM_EXTENSIONS, &num_extensions);
    for (GLint i = 0; i < num_extensions; i++)
    {
        const char* extension = (const char*)glGetStringi(GL_EXTENSIONS, i);
        if (strcmp(extension, "GL_ARB_clip_control") == 0)
            g_HasClipOrigin = true;
    }
#endif

    return true;
}